

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_iarchive.h
# Opt level: O2

void __thiscall serialization::json_iarchive::load_data(json_iarchive *this,char *data)

{
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
  ::Parse<0u,rapidjson::UTF8<char>>
            ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
              *)this,data);
  if ((this->doc_).parseResult_.code_ != kParseErrorNone) {
    throw_serialization_error("json","parse");
    return;
  }
  return;
}

Assistant:

void load_data(const char * data)
    {
        doc_.Parse(data);
        if(doc_.GetParseError())
        {
            throw_serialization_error("json", "parse");
        }
    }